

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_striped_sse41_128_32.c
# Opt level: O1

parasail_result_t *
parasail_nw_rowcol_striped_profile_sse41_128_32
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  int *piVar1;
  uint *puVar2;
  undefined4 *puVar3;
  int iVar4;
  void *pvVar5;
  parasail_matrix_t *ppVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  int iVar10;
  uint uVar11;
  parasail_result_t *ppVar12;
  __m128i *ptr;
  __m128i *palVar13;
  __m128i *ptr_00;
  int32_t *ptr_01;
  int iVar14;
  int iVar15;
  uint uVar16;
  ulong uVar17;
  int iVar18;
  uint uVar19;
  __m128i *palVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  int iVar24;
  int iVar25;
  int32_t segNum;
  long lVar26;
  ulong uVar27;
  int iVar28;
  ulong uVar29;
  long lVar30;
  int iVar31;
  __m128i *ptr_02;
  bool bVar32;
  undefined1 auVar33 [16];
  uint uVar34;
  uint uVar36;
  uint uVar37;
  uint uVar38;
  undefined1 auVar35 [16];
  uint uVar39;
  uint uVar40;
  uint uVar41;
  uint uVar42;
  uint uVar43;
  uint uVar44;
  uint uVar45;
  uint uVar47;
  ulong uVar46;
  int iVar48;
  uint uVar50;
  uint uVar51;
  int iVar52;
  uint uVar53;
  int iVar54;
  int iVar57;
  int iVar58;
  int iVar59;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  uint uVar60;
  uint uVar61;
  int iVar62;
  uint uVar63;
  int iVar64;
  uint uVar65;
  int iVar66;
  __m128i_32_t e;
  __m128i_32_t h;
  longlong local_58;
  longlong lStack_50;
  longlong local_48;
  longlong lStack_40;
  int32_t iVar49;
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_nw_rowcol_striped_profile_sse41_128_32_cold_8();
  }
  else {
    pvVar5 = (profile->profile32).score;
    if (pvVar5 == (void *)0x0) {
      parasail_nw_rowcol_striped_profile_sse41_128_32_cold_7();
    }
    else {
      ppVar6 = profile->matrix;
      if (ppVar6 == (parasail_matrix_t *)0x0) {
        parasail_nw_rowcol_striped_profile_sse41_128_32_cold_6();
      }
      else {
        uVar34 = profile->s1Len;
        if ((int)uVar34 < 1) {
          parasail_nw_rowcol_striped_profile_sse41_128_32_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_nw_rowcol_striped_profile_sse41_128_32_cold_4();
        }
        else if (s2Len < 1) {
          parasail_nw_rowcol_striped_profile_sse41_128_32_cold_3();
        }
        else if (open < 0) {
          parasail_nw_rowcol_striped_profile_sse41_128_32_cold_2();
        }
        else if (gap < 0) {
          parasail_nw_rowcol_striped_profile_sse41_128_32_cold_1();
        }
        else {
          iVar31 = uVar34 - 1;
          uVar29 = (ulong)uVar34 + 3 >> 2;
          iVar28 = (int)uVar29;
          iVar10 = iVar31 / iVar28;
          uVar19 = iVar31 % iVar28;
          iVar18 = -open;
          iVar24 = ppVar6->min;
          uVar16 = 0x80000000 - iVar24;
          if (iVar24 != iVar18 && SBORROW4(iVar24,iVar18) == iVar24 + open < 0) {
            uVar16 = open | 0x80000000;
          }
          uVar11 = 0x7ffffffe - ppVar6->max;
          ppVar12 = parasail_result_new_rowcol1((uint)((ulong)uVar34 + 3) & 0x7ffffffc,s2Len);
          if (ppVar12 != (parasail_result_t *)0x0) {
            ppVar12->flag = ppVar12->flag | 0x4440801;
            ptr = parasail_memalign___m128i(0x10,uVar29);
            palVar13 = parasail_memalign___m128i(0x10,uVar29);
            ptr_00 = parasail_memalign___m128i(0x10,uVar29);
            ptr_01 = parasail_memalign_int32_t(0x10,(ulong)(s2Len + 1));
            if ((ptr_01 != (int32_t *)0x0 && ptr_00 != (__m128i *)0x0) &&
                (palVar13 != (__m128i *)0x0 && ptr != (__m128i *)0x0)) {
              iVar14 = s2Len + -1;
              iVar15 = 3 - iVar10;
              uVar16 = uVar16 + 1;
              uVar21 = 0;
              iVar24 = iVar18;
              do {
                lVar26 = 0;
                iVar25 = iVar24;
                do {
                  *(int *)((long)&local_48 + lVar26 * 4) = iVar25;
                  lVar30 = (long)iVar25 - (ulong)(uint)open;
                  if (lVar30 < -0x7fffffff) {
                    lVar30 = -0x80000000;
                  }
                  *(int *)((long)&local_58 + lVar26 * 4) = (int)lVar30;
                  lVar26 = lVar26 + 1;
                  iVar25 = iVar25 - gap * iVar28;
                } while (lVar26 != 4);
                ptr[uVar21][0] = local_48;
                ptr[uVar21][1] = lStack_40;
                ptr_00[uVar21][0] = local_58;
                ptr_00[uVar21][1] = lStack_50;
                uVar21 = uVar21 + 1;
                iVar24 = iVar24 - gap;
              } while (uVar21 != uVar29);
              *ptr_01 = 0;
              uVar21 = 1;
              do {
                ptr_01[uVar21] = iVar18;
                uVar21 = uVar21 + 1;
                iVar18 = iVar18 - gap;
              } while (s2Len + 1 != uVar21);
              uVar21 = (ulong)(iVar28 + (uint)(iVar28 == 0));
              iVar24 = 1;
              if (1 < iVar15) {
                iVar24 = iVar15;
              }
              uVar23 = 1;
              if (1 < s2Len) {
                uVar23 = (ulong)(uint)s2Len;
              }
              uVar17 = 0;
              uVar34 = uVar16;
              uVar36 = uVar16;
              uVar37 = uVar16;
              uVar38 = uVar16;
              uVar39 = uVar11;
              uVar40 = uVar11;
              uVar41 = uVar11;
              uVar42 = uVar11;
              do {
                ptr_02 = ptr;
                ptr = palVar13;
                iVar4 = ppVar6->mapper[(byte)s2[uVar17]];
                palVar13 = ptr_02 + (iVar28 - 1);
                iVar18 = (int)(*palVar13)[0];
                iVar25 = *(int *)((long)*palVar13 + 4);
                iVar52 = (int)(*palVar13)[1];
                iVar49 = ptr_01[uVar17];
                lVar26 = 0;
                uVar43 = uVar16;
                uVar44 = uVar16;
                uVar45 = uVar16;
                uVar47 = uVar16;
                do {
                  piVar1 = (int *)((long)pvVar5 + lVar26 + uVar29 * (long)iVar4 * 0x10);
                  iVar48 = iVar49 + *piVar1;
                  iVar18 = iVar18 + piVar1[1];
                  iVar25 = iVar25 + piVar1[2];
                  iVar52 = iVar52 + piVar1[3];
                  piVar1 = (int *)((long)*ptr_00 + lVar26);
                  iVar54 = *piVar1;
                  iVar57 = piVar1[1];
                  iVar58 = piVar1[2];
                  iVar59 = piVar1[3];
                  uVar60 = (iVar54 < (int)uVar43) * uVar43 | (uint)(iVar54 >= (int)uVar43) * iVar54;
                  uVar61 = (iVar57 < (int)uVar44) * uVar44 | (uint)(iVar57 >= (int)uVar44) * iVar57;
                  uVar63 = (iVar58 < (int)uVar45) * uVar45 | (uint)(iVar58 >= (int)uVar45) * iVar58;
                  uVar65 = (iVar59 < (int)uVar47) * uVar47 | (uint)(iVar59 >= (int)uVar47) * iVar59;
                  uVar60 = (uint)((int)uVar60 < iVar48) * iVar48 | ((int)uVar60 >= iVar48) * uVar60;
                  uVar61 = (uint)((int)uVar61 < iVar18) * iVar18 | ((int)uVar61 >= iVar18) * uVar61;
                  uVar63 = (uint)((int)uVar63 < iVar25) * iVar25 | ((int)uVar63 >= iVar25) * uVar63;
                  uVar65 = (uint)((int)uVar65 < iVar52) * iVar52 | ((int)uVar65 >= iVar52) * uVar65;
                  puVar2 = (uint *)((long)*ptr + lVar26);
                  *puVar2 = uVar60;
                  puVar2[1] = uVar61;
                  puVar2[2] = uVar63;
                  puVar2[3] = uVar65;
                  uVar34 = ((int)uVar34 < (int)uVar60) * uVar60 |
                           ((int)uVar34 >= (int)uVar60) * uVar34;
                  uVar36 = ((int)uVar36 < (int)uVar61) * uVar61 |
                           ((int)uVar36 >= (int)uVar61) * uVar36;
                  uVar37 = ((int)uVar37 < (int)uVar63) * uVar63 |
                           ((int)uVar37 >= (int)uVar63) * uVar37;
                  uVar38 = ((int)uVar38 < (int)uVar65) * uVar65 |
                           ((int)uVar38 >= (int)uVar65) * uVar38;
                  uVar39 = (uint)(iVar54 < (int)uVar39) * iVar54 | (iVar54 >= (int)uVar39) * uVar39;
                  uVar40 = (uint)(iVar57 < (int)uVar40) * iVar57 | (iVar57 >= (int)uVar40) * uVar40;
                  uVar41 = (uint)(iVar58 < (int)uVar41) * iVar58 | (iVar58 >= (int)uVar41) * uVar41;
                  uVar42 = (uint)(iVar59 < (int)uVar42) * iVar59 | (iVar59 >= (int)uVar42) * uVar42;
                  uVar39 = ((int)uVar43 < (int)uVar39) * uVar43 |
                           ((int)uVar43 >= (int)uVar39) * uVar39;
                  uVar40 = ((int)uVar44 < (int)uVar40) * uVar44 |
                           ((int)uVar44 >= (int)uVar40) * uVar40;
                  uVar41 = ((int)uVar45 < (int)uVar41) * uVar45 |
                           ((int)uVar45 >= (int)uVar41) * uVar41;
                  uVar42 = ((int)uVar47 < (int)uVar42) * uVar47 |
                           ((int)uVar47 >= (int)uVar42) * uVar42;
                  uVar39 = ((int)uVar60 < (int)uVar39) * uVar60 |
                           ((int)uVar60 >= (int)uVar39) * uVar39;
                  uVar40 = ((int)uVar61 < (int)uVar40) * uVar61 |
                           ((int)uVar61 >= (int)uVar40) * uVar40;
                  uVar41 = ((int)uVar63 < (int)uVar41) * uVar63 |
                           ((int)uVar63 >= (int)uVar41) * uVar41;
                  uVar42 = ((int)uVar65 < (int)uVar42) * uVar65 |
                           ((int)uVar65 >= (int)uVar42) * uVar42;
                  iVar48 = uVar60 - open;
                  iVar62 = uVar61 - open;
                  iVar64 = uVar63 - open;
                  iVar66 = uVar65 - open;
                  iVar54 = iVar54 - gap;
                  iVar57 = iVar57 - gap;
                  iVar58 = iVar58 - gap;
                  iVar59 = iVar59 - gap;
                  puVar2 = (uint *)((long)*ptr_00 + lVar26);
                  *puVar2 = (uint)(iVar54 < iVar48) * iVar48 | (uint)(iVar54 >= iVar48) * iVar54;
                  puVar2[1] = (uint)(iVar57 < iVar62) * iVar62 | (uint)(iVar57 >= iVar62) * iVar57;
                  puVar2[2] = (uint)(iVar58 < iVar64) * iVar64 | (uint)(iVar58 >= iVar64) * iVar58;
                  puVar2[3] = (uint)(iVar59 < iVar66) * iVar66 | (uint)(iVar59 >= iVar66) * iVar59;
                  iVar18 = uVar43 - gap;
                  iVar25 = uVar44 - gap;
                  iVar52 = uVar45 - gap;
                  iVar54 = uVar47 - gap;
                  uVar43 = (uint)(iVar18 < iVar48) * iVar48 | (uint)(iVar18 >= iVar48) * iVar18;
                  uVar44 = (uint)(iVar25 < iVar62) * iVar62 | (uint)(iVar25 >= iVar62) * iVar25;
                  uVar45 = (uint)(iVar52 < iVar64) * iVar64 | (uint)(iVar52 >= iVar64) * iVar52;
                  uVar47 = (uint)(iVar54 < iVar66) * iVar66 | (uint)(iVar54 >= iVar66) * iVar54;
                  piVar1 = (int *)((long)*ptr_02 + lVar26);
                  iVar49 = *piVar1;
                  iVar18 = piVar1[1];
                  iVar25 = piVar1[2];
                  iVar52 = piVar1[3];
                  lVar26 = lVar26 + 0x10;
                } while (uVar21 << 4 != lVar26);
                uVar22 = (ulong)(iVar28 - 1) * 0x10;
                uVar47 = 0;
                do {
                  iVar54 = ptr_01[uVar17 + 1] - open;
                  iVar18 = (int)(*ptr)[0];
                  iVar25 = *(int *)((long)*ptr + 4);
                  iVar52 = (int)(*ptr)[1];
                  iVar4 = *(int *)((long)*ptr + 0xc);
                  uVar65 = (uint)(iVar18 < iVar54) * iVar54 | (uint)(iVar18 >= iVar54) * iVar18;
                  uVar50 = (iVar25 < (int)uVar43) * uVar43 | (uint)(iVar25 >= (int)uVar43) * iVar25;
                  uVar51 = (iVar52 < (int)uVar44) * uVar44 | (uint)(iVar52 >= (int)uVar44) * iVar52;
                  uVar53 = (iVar4 < (int)uVar45) * uVar45 | (uint)(iVar4 >= (int)uVar45) * iVar4;
                  *(uint *)*ptr = uVar65;
                  *(uint *)((long)*ptr + 4) = uVar50;
                  *(uint *)(*ptr + 1) = uVar51;
                  *(uint *)((long)*ptr + 0xc) = uVar53;
                  uVar39 = ((int)uVar65 < (int)uVar39) * uVar65 |
                           ((int)uVar65 >= (int)uVar39) * uVar39;
                  uVar40 = ((int)uVar50 < (int)uVar40) * uVar50 |
                           ((int)uVar50 >= (int)uVar40) * uVar40;
                  uVar41 = ((int)uVar51 < (int)uVar41) * uVar51 |
                           ((int)uVar51 >= (int)uVar41) * uVar41;
                  uVar42 = ((int)uVar53 < (int)uVar42) * uVar53 |
                           ((int)uVar53 >= (int)uVar42) * uVar42;
                  uVar34 = ((int)uVar34 < (int)uVar65) * uVar65 |
                           ((int)uVar34 >= (int)uVar65) * uVar34;
                  uVar36 = ((int)uVar36 < (int)uVar50) * uVar50 |
                           ((int)uVar36 >= (int)uVar50) * uVar36;
                  uVar37 = ((int)uVar37 < (int)uVar51) * uVar51 |
                           ((int)uVar37 >= (int)uVar51) * uVar37;
                  uVar38 = ((int)uVar38 < (int)uVar53) * uVar53 |
                           ((int)uVar38 >= (int)uVar53) * uVar38;
                  uVar60 = iVar54 - gap;
                  uVar61 = uVar43 - gap;
                  uVar63 = uVar44 - gap;
                  iVar25 = uVar45 - gap;
                  auVar55._0_4_ = -(uint)((int)(uVar65 - open) < (int)uVar60);
                  auVar55._4_4_ = -(uint)((int)(uVar50 - open) < (int)uVar61);
                  auVar55._8_4_ = -(uint)((int)(uVar51 - open) < (int)uVar63);
                  auVar55._12_4_ = -(uint)((int)(uVar53 - open) < iVar25);
                  iVar18 = movmskps(iVar54,auVar55);
                  if (iVar18 == 0) {
                    bVar32 = true;
                    uVar43 = uVar60;
                    uVar44 = uVar61;
                    uVar45 = uVar63;
                  }
                  else {
                    uVar46 = 1;
                    palVar13 = ptr;
                    do {
                      uVar27 = uVar46;
                      palVar20 = palVar13 + 1;
                      if (uVar21 == uVar27) break;
                      iVar18 = (int)(*palVar20)[0];
                      iVar52 = *(int *)((long)palVar13[1] + 4);
                      iVar4 = (int)palVar13[1][1];
                      iVar54 = *(int *)((long)palVar13[1] + 0xc);
                      uVar43 = (iVar18 < (int)uVar60) * uVar60 |
                               (uint)(iVar18 >= (int)uVar60) * iVar18;
                      uVar44 = (iVar52 < (int)uVar61) * uVar61 |
                               (uint)(iVar52 >= (int)uVar61) * iVar52;
                      uVar45 = (iVar4 < (int)uVar63) * uVar63 | (uint)(iVar4 >= (int)uVar63) * iVar4
                      ;
                      uVar65 = (uint)(iVar54 < iVar25) * iVar25 | (uint)(iVar54 >= iVar25) * iVar54;
                      *(uint *)*palVar20 = uVar43;
                      *(uint *)((long)palVar13[1] + 4) = uVar44;
                      *(uint *)(palVar13[1] + 1) = uVar45;
                      *(uint *)((long)palVar13[1] + 0xc) = uVar65;
                      uVar39 = ((int)uVar43 < (int)uVar39) * uVar43 |
                               ((int)uVar43 >= (int)uVar39) * uVar39;
                      uVar40 = ((int)uVar44 < (int)uVar40) * uVar44 |
                               ((int)uVar44 >= (int)uVar40) * uVar40;
                      uVar41 = ((int)uVar45 < (int)uVar41) * uVar45 |
                               ((int)uVar45 >= (int)uVar41) * uVar41;
                      uVar42 = ((int)uVar65 < (int)uVar42) * uVar65 |
                               ((int)uVar65 >= (int)uVar42) * uVar42;
                      uVar34 = ((int)uVar34 < (int)uVar43) * uVar43 |
                               ((int)uVar34 >= (int)uVar43) * uVar34;
                      uVar36 = ((int)uVar36 < (int)uVar44) * uVar44 |
                               ((int)uVar36 >= (int)uVar44) * uVar36;
                      uVar37 = ((int)uVar37 < (int)uVar45) * uVar45 |
                               ((int)uVar37 >= (int)uVar45) * uVar37;
                      uVar38 = ((int)uVar38 < (int)uVar65) * uVar65 |
                               ((int)uVar38 >= (int)uVar65) * uVar38;
                      uVar60 = uVar60 - gap;
                      uVar61 = uVar61 - gap;
                      uVar63 = uVar63 - gap;
                      iVar25 = iVar25 - gap;
                      auVar56._0_4_ = -(uint)((int)(uVar43 - open) < (int)uVar60);
                      auVar56._4_4_ = -(uint)((int)(uVar44 - open) < (int)uVar61);
                      auVar56._8_4_ = -(uint)((int)(uVar45 - open) < (int)uVar63);
                      auVar56._12_4_ = -(uint)((int)(uVar65 - open) < iVar25);
                      uVar43 = movmskps((int)uVar22,auVar56);
                      uVar22 = (ulong)uVar43;
                      uVar46 = uVar27 + 1;
                      palVar13 = palVar20;
                    } while (uVar43 != 0);
                    bVar32 = uVar27 < uVar29;
                    uVar43 = uVar60;
                    uVar44 = uVar61;
                    uVar45 = uVar63;
                  }
                  if (bVar32) break;
                  uVar22 = (ulong)(uVar47 + 1);
                  bVar32 = uVar47 < 3;
                  uVar47 = uVar47 + 1;
                } while (bVar32);
                uVar22 = ptr[uVar19][0];
                uVar46 = ptr[uVar19][1];
                iVar18 = iVar24;
                if (iVar10 < 3) {
                  do {
                    uVar46 = uVar46 << 0x20 | uVar22 >> 0x20;
                    iVar18 = iVar18 + -1;
                    uVar22 = uVar22 << 0x20;
                  } while (iVar18 != 0);
                }
                ((ppVar12->field_4).rowcols)->score_row[uVar17] = (int)(uVar46 >> 0x20);
                uVar17 = uVar17 + 1;
                palVar13 = ptr_02;
                if (uVar17 == uVar23) {
                  lVar26 = 0;
                  do {
                    puVar3 = (undefined4 *)((long)*ptr + lVar26 * 4);
                    uVar7 = puVar3[1];
                    uVar8 = puVar3[2];
                    uVar9 = puVar3[3];
                    piVar1 = ((ppVar12->field_4).rowcols)->score_col;
                    *(undefined4 *)((long)piVar1 + lVar26) = *puVar3;
                    *(undefined4 *)((long)piVar1 + uVar29 * 4 + lVar26) = uVar7;
                    *(undefined4 *)((long)piVar1 + uVar29 * 8 + lVar26) = uVar8;
                    *(undefined4 *)((long)piVar1 + uVar29 * 0xc + lVar26) = uVar9;
                    lVar26 = lVar26 + 4;
                  } while ((ulong)(iVar28 + (uint)(iVar28 == 0)) << 2 != lVar26);
                  iVar24 = uVar19 * 0x10;
                  uVar29 = ptr[uVar19][0];
                  uVar21 = ptr[uVar19][1];
                  if (iVar10 < 3) {
                    iVar24 = 1;
                    if (1 < iVar15) {
                      iVar24 = iVar15;
                    }
                    do {
                      uVar21 = uVar21 << 0x20 | uVar29 >> 0x20;
                      iVar24 = iVar24 + -1;
                      uVar29 = uVar29 << 0x20;
                    } while (iVar24 != 0);
                  }
                  auVar33._0_4_ = -(uint)((int)uVar39 < (int)uVar16);
                  auVar33._4_4_ = -(uint)((int)uVar40 < (int)uVar16);
                  auVar33._8_4_ = -(uint)((int)uVar41 < (int)uVar16);
                  auVar33._12_4_ = -(uint)((int)uVar42 < (int)uVar16);
                  auVar35._0_4_ = -(uint)((int)uVar11 < (int)uVar34);
                  auVar35._4_4_ = -(uint)((int)uVar11 < (int)uVar36);
                  auVar35._8_4_ = -(uint)((int)uVar11 < (int)uVar37);
                  auVar35._12_4_ = -(uint)((int)uVar11 < (int)uVar38);
                  iVar24 = movmskps(iVar24,auVar35 | auVar33);
                  if (iVar24 == 0) {
                    iVar24 = (int)(uVar21 >> 0x20);
                  }
                  else {
                    *(byte *)&ppVar12->flag = (byte)ppVar12->flag | 0x40;
                    iVar24 = 0;
                    iVar14 = 0;
                    iVar31 = 0;
                  }
                  ppVar12->score = iVar24;
                  ppVar12->end_query = iVar31;
                  ppVar12->end_ref = iVar14;
                  parasail_free(ptr_01);
                  parasail_free(ptr_00);
                  parasail_free(ptr_02);
                  parasail_free(ptr);
                  return ppVar12;
                }
              } while( true );
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict vProfile = NULL;
    __m128i* restrict pvHStore = NULL;
    __m128i* restrict pvHLoad = NULL;
    __m128i* restrict pvE = NULL;
    int32_t* restrict boundary = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int32_t NEG_LIMIT = 0;
    int32_t POS_LIMIT = 0;
    int32_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile32.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 4; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    vProfile = (__m128i*)profile->profile32.score;
    vGapO = _mm_set1_epi32(open);
    vGapE = _mm_set1_epi32(gap);
    NEG_LIMIT = (-open < matrix->min ? INT32_MIN + open : INT32_MIN - matrix->min) + 1;
    POS_LIMIT = INT32_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi32(NEG_LIMIT);
    vPosLimit = _mm_set1_epi32(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_BITS_32 | PARASAIL_FLAG_LANES_4;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore = parasail_memalign___m128i(16, segLen);
    pvHLoad  = parasail_memalign___m128i(16, segLen);
    pvE      = parasail_memalign___m128i(16, segLen);
    boundary = parasail_memalign_int32_t(16, s2Len+1);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvE) return NULL;
    if (!boundary) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_32_t h;
            __m128i_32_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = -open-gap*(segNum*segLen+i);
                h.v[segNum] = tmp < INT32_MIN ? INT32_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT32_MIN ? INT32_MIN : tmp;
            }
            _mm_store_si128(&pvHStore[index], h.m);
            _mm_store_si128(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = -open-gap*(i-1);
            boundary[i] = tmp < INT32_MIN ? INT32_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        /* Initialize F value to -inf.  Any errors to vH values will be
         * corrected in the Lazy_F loop.  */
        __m128i vF = vNegLimit;

        /* load final segment of pvHStore and shift left by 2 bytes */
        __m128i vH = _mm_slli_si128(pvHStore[segLen - 1], 4);

        /* Correct part of the vProfile */
        const __m128i* vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;

        /* Swap the 2 H buffers. */
        __m128i* pv = pvHLoad;
        pvHLoad = pvHStore;
        pvHStore = pv;

        /* insert upper boundary condition */
        vH = _mm_insert_epi32(vH, boundary[j], 0);

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            vH = _mm_add_epi32(vH, _mm_load_si128(vP + i));
            vE = _mm_load_si128(pvE + i);

            /* Get max from vH, vE and vF. */
            vH = _mm_max_epi32(vH, vE);
            vH = _mm_max_epi32(vH, vF);
            /* Save vH values. */
            _mm_store_si128(pvHStore + i, vH);
            vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vH);
            vSaturationCheckMin = _mm_min_epi32(vSaturationCheckMin, vH);
            vSaturationCheckMin = _mm_min_epi32(vSaturationCheckMin, vE);
            vSaturationCheckMin = _mm_min_epi32(vSaturationCheckMin, vF);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif

            /* Update vE value. */
            vH = _mm_sub_epi32(vH, vGapO);
            vE = _mm_sub_epi32(vE, vGapE);
            vE = _mm_max_epi32(vE, vH);
            _mm_store_si128(pvE + i, vE);

            /* Update vF value. */
            vF = _mm_sub_epi32(vF, vGapE);
            vF = _mm_max_epi32(vF, vH);

            /* Load the next vH. */
            vH = _mm_load_si128(pvHLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            int64_t tmp = boundary[j+1]-open;
            int32_t tmp2 = tmp < INT32_MIN ? INT32_MIN : tmp;
            vF = _mm_slli_si128(vF, 4);
            vF = _mm_insert_epi32(vF, tmp2, 0);
            for (i=0; i<segLen; ++i) {
                vH = _mm_load_si128(pvHStore + i);
                vH = _mm_max_epi32(vH,vF);
                _mm_store_si128(pvHStore + i, vH);
                vSaturationCheckMin = _mm_min_epi32(vSaturationCheckMin, vH);
                vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
                arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                vH = _mm_sub_epi32(vH, vGapO);
                vF = _mm_sub_epi32(vF, vGapE);
                if (! _mm_movemask_epi8(_mm_cmpgt_epi32(vF, vH))) goto end;
                /*vF = _mm_max_epi32(vF, vH);*/
            }
        }
end:
        {
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm_load_si128(pvHStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 4);
            }
            result->rowcols->score_row[j] = (int32_t) _mm_extract_epi32 (vH, 3);
        }
#endif
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvHStore+i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    /* extract last value from the last column */
    {
        __m128i vH = _mm_load_si128(pvHStore + offset);
        for (k=0; k<position; ++k) {
            vH = _mm_slli_si128 (vH, 4);
        }
        score = (int32_t) _mm_extract_epi32 (vH, 3);
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi32(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi32(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(boundary);
    parasail_free(pvE);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}